

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O1

bool __thiscall
rapidjson::
Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::WriteDouble(Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
              *this,double d)

{
  int maxDecimalPlaces;
  ulong uVar1;
  char *pcVar2;
  char *pcVar3;
  int length;
  char buffer [25];
  int local_60;
  int local_5c;
  char local_58;
  char acStack_57 [39];
  
  uVar1 = (ulong)d & 0x7ff0000000000000;
  if (uVar1 != 0x7ff0000000000000) {
    if ((d != 0.0) || (NAN(d))) {
      maxDecimalPlaces = this->maxDecimalPlaces_;
      if (0.0 <= d) {
        pcVar2 = &local_58;
      }
      else {
        pcVar2 = acStack_57;
        local_58 = '-';
        d = -d;
      }
      internal::Grisu2(d,pcVar2,&local_5c,&local_60);
      pcVar2 = internal::Prettify(pcVar2,local_5c,local_60,maxDecimalPlaces);
    }
    else {
      if ((long)d < 0) {
        pcVar2 = acStack_57;
        local_58 = '-';
      }
      else {
        pcVar2 = &local_58;
      }
      pcVar2[0] = '0';
      pcVar2[1] = '.';
      pcVar2[2] = '0';
      pcVar2 = pcVar2 + 3;
    }
    for (pcVar3 = &local_58; pcVar3 != pcVar2; pcVar3 = pcVar3 + 1) {
      std::ostream::put((char)this->os_->stream_);
    }
  }
  return uVar1 != 0x7ff0000000000000;
}

Assistant:

bool WriteDouble(double d) {
        if (internal::Double(d).IsNanOrInf()) {
            if (!(writeFlags & kWriteNanAndInfFlag) && !(writeFlags & kWriteNanAndInfNullFlag))
                return false;
            if (writeFlags & kWriteNanAndInfNullFlag) {
                PutReserve(*os_, 4);
                PutUnsafe(*os_, 'n'); PutUnsafe(*os_, 'u'); PutUnsafe(*os_, 'l'); PutUnsafe(*os_, 'l');
                return true;
            }
            if (internal::Double(d).IsNan()) {
                PutReserve(*os_, 3);
                PutUnsafe(*os_, 'N'); PutUnsafe(*os_, 'a'); PutUnsafe(*os_, 'N');
                return true;
            }
            if (internal::Double(d).Sign()) {
                PutReserve(*os_, 9);
                PutUnsafe(*os_, '-');
            }
            else
                PutReserve(*os_, 8);
            PutUnsafe(*os_, 'I'); PutUnsafe(*os_, 'n'); PutUnsafe(*os_, 'f');
            PutUnsafe(*os_, 'i'); PutUnsafe(*os_, 'n'); PutUnsafe(*os_, 'i'); PutUnsafe(*os_, 't'); PutUnsafe(*os_, 'y');
            return true;
        }

        char buffer[25];
        char* end = internal::dtoa(d, buffer, maxDecimalPlaces_);
        PutReserve(*os_, static_cast<size_t>(end - buffer));
        for (char* p = buffer; p != end; ++p)
            PutUnsafe(*os_, static_cast<typename OutputStream::Ch>(*p));
        return true;
    }